

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Array<kj::_::KeyMaybeVal> *
kj::_::toKeysAndVals
          (Array<kj::_::KeyMaybeVal> *__return_storage_ptr__,
          ArrayPtr<kj::ArrayPtr<const_char>_> *params)

{
  ulong *puVar1;
  size_t sVar2;
  ArrayPtr<const_char> *pAVar3;
  char *__s;
  KeyMaybeVal *pKVar4;
  void *pvVar5;
  long lVar6;
  anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_char>_>_2 *paVar7;
  ArrayPtr<const_char> local_68;
  char local_58;
  ArrayPtr<const_char> local_50;
  size_t local_40;
  Array<kj::_::KeyMaybeVal> *local_38;
  
  local_40 = params->size_;
  local_38 = __return_storage_ptr__;
  pKVar4 = (KeyMaybeVal *)
           HeapArrayDisposer::allocateImpl
                     (0x28,local_40,local_40,
                      HeapArrayDisposer::Allocate_<kj::_::KeyMaybeVal>::construct,
                      ArrayDisposer::Dispose_<kj::_::KeyMaybeVal>::destruct);
  sVar2 = params->size_;
  if (sVar2 != 0) {
    pAVar3 = params->ptr;
    paVar7 = &(pKVar4->val).ptr.field_1;
    lVar6 = 0;
    do {
      local_58 = '\0';
      __s = *(char **)((long)&pAVar3->ptr + lVar6);
      pvVar5 = memchr(__s,0x3d,*(size_t *)((long)&pAVar3->size_ + lVar6));
      if (pvVar5 == (void *)0x0) {
        puVar1 = (ulong *)((long)&pAVar3->size_ + lVar6);
        local_68.ptr = (char *)puVar1[-1];
        local_68.size_ = *puVar1;
      }
      else {
        local_68.ptr = __s;
        local_68.size_ = (long)pvVar5 - (long)__s;
        stripLeadingAndTrailingSpace(&local_68);
        local_50.size_ = ~((long)pvVar5 - (long)__s) + *(long *)((long)&pAVar3->size_ + lVar6);
        local_50.ptr = (char *)((long)pvVar5 + 1);
        local_58 = '\x01';
        stripLeadingAndTrailingSpace(&local_50);
      }
      *(char **)((long)paVar7 + -0x18) = local_68.ptr;
      *(size_t *)&paVar7[-1].value = local_68.size_;
      if (((NullableValue<kj::ArrayPtr<const_char>_> *)((long)paVar7 + -8))->isSet == true) {
        ((NullableValue<kj::ArrayPtr<const_char>_> *)((long)paVar7 + -8))->isSet = false;
      }
      if (local_58 == '\x01') {
        (paVar7->value).ptr = local_50.ptr;
        *(size_t *)((long)paVar7 + 8) = local_50.size_;
        ((NullableValue<kj::ArrayPtr<const_char>_> *)((long)paVar7 + -8))->isSet = true;
      }
      paVar7 = (anon_union_16_1_a8c68091_for_NullableValue<kj::ArrayPtr<const_char>_>_2 *)
               ((long)paVar7 + 0x28);
      lVar6 = lVar6 + 0x10;
    } while (sVar2 << 4 != lVar6);
  }
  local_38->ptr = pKVar4;
  local_38->size_ = local_40;
  local_38->disposer = (ArrayDisposer *)&HeapArrayDisposer::instance;
  return local_38;
}

Assistant:

kj::Array<KeyMaybeVal> toKeysAndVals(const kj::ArrayPtr<kj::ArrayPtr<const char>>& params) {
  // Given a collection of parameters (a single offer), parse the parameters into <key, MaybeValue>
  // pairs. If the parameter contains an `=`, we set the `key` to everything before, and the `value`
  // to everything after. Otherwise, we set the `key` to be the entire parameter.
  // Either way, both the key and value (if it exists) are stripped of leading & trailing whitespace.
  auto result = kj::heapArray<KeyMaybeVal>(params.size());
  size_t count = 0;
  for (const auto& param : params) {
    kj::ArrayPtr<const char> key;
    kj::Maybe<kj::ArrayPtr<const char>> value;

    KJ_IF_SOME(index, param.findFirst('=')) {
      // Found '=' so we have a value.
      key = param.first(index);
      stripLeadingAndTrailingSpace(key);
      value = param.slice(index + 1, param.size());
      KJ_IF_SOME(v, value) {
        stripLeadingAndTrailingSpace(v);
      }
    } else {
      key = kj::mv(param);
    }

    result[count].key = kj::mv(key);
    result[count].val = kj::mv(value);
    ++count;
  }